

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  uint uVar1;
  timeval ctv;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  uVar1 = timeval_comp(&f->timeout,(timeval *)&local_20);
  return uVar1 >> 0x1f ^ fev_none;
}

Assistant:

static pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,
                                       UNUSED pcp_recv_msg_t *msg) {
    struct timeval ctv;

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) < 0) {
        return fev_failed;
    }

    return fev_none;
}